

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_config.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  long lVar1;
  Config *this_local;
  
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_00201578;
  lVar1 = *(long *)(*(long *)&this->m_os + -0x18);
  cout();
  std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)(&this->m_os + lVar1));
  Stream::release(&this->m_stream);
  TestSpec::~TestSpec(&this->m_testSpec);
  std::ostream::~ostream(&this->m_os);
  ConfigData::~ConfigData(&this->m_data);
  SharedImpl<Catch::IConfig>::~SharedImpl(&this->super_SharedImpl<Catch::IConfig>);
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( Catch::cout().rdbuf() );
            m_stream.release();
        }